

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O1

int ON_String::MapStringOrdinal
              (ON_StringMapOrdinalType map_type,char *string,int element_count,char *mapped_string,
              int mapped_string_capacity)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  byte *pbVar5;
  byte bVar6;
  ulong uVar4;
  
  uVar4 = (ulong)(uint)element_count;
  if (mapped_string_capacity != 0) {
    if (mapped_string_capacity < 1 || mapped_string == (char *)0x0) {
      return 0;
    }
    if (string != mapped_string) {
      *mapped_string = '\0';
    }
  }
  if (element_count < 0) {
    uVar2 = Length(string);
    uVar4 = (ulong)uVar2;
    if ((int)uVar2 < 0) {
      return 0;
    }
    if (mapped_string_capacity == 0) {
      return uVar2 + 1;
    }
  }
  else if (mapped_string_capacity == 0) {
    return element_count;
  }
  iVar3 = (int)uVar4;
  if (mapped_string_capacity < iVar3) {
    return 0;
  }
  pbVar5 = (byte *)(string + uVar4);
  if ((map_type == UpperOrdinal) || (map_type == MinimumOrdinal)) {
    if (iVar3 != 0) {
      do {
        bVar1 = *string;
        string = (char *)((byte *)string + 1);
        bVar6 = bVar1 - 0x20;
        if (0x19 < (byte)(bVar1 + 0x9f)) {
          bVar6 = bVar1;
        }
        *mapped_string = bVar6;
        mapped_string = (char *)((byte *)mapped_string + 1);
      } while (string < pbVar5);
    }
  }
  else if (map_type == LowerOrdinal) {
    if (iVar3 != 0) {
      do {
        bVar1 = *string;
        string = (char *)((byte *)string + 1);
        bVar6 = bVar1 | 0x20;
        if (0x19 < (byte)(bVar1 + 0xbf)) {
          bVar6 = bVar1;
        }
        *mapped_string = bVar6;
        mapped_string = (char *)((byte *)mapped_string + 1);
      } while (string < pbVar5);
    }
  }
  else if (iVar3 != 0) {
    do {
      bVar1 = *string;
      string = (char *)((byte *)string + 1);
      *mapped_string = bVar1;
      mapped_string = (char *)((byte *)mapped_string + 1);
    } while (string < pbVar5);
  }
  if (iVar3 < mapped_string_capacity) {
    *mapped_string = 0;
    return iVar3;
  }
  return iVar3;
}

Assistant:

int ON_String::MapStringOrdinal(
  ON_StringMapOrdinalType map_type,
  const char* string,
  int element_count,
  char* mapped_string,
  int mapped_string_capacity
  )
{
  if (0 != mapped_string_capacity)
  {
    if (nullptr == mapped_string || mapped_string_capacity <= 0)
      return 0;

    if (string != mapped_string)
      mapped_string[0] = 0;
  }

  if (element_count < 0)
  {
    element_count = ON_String::Length(string);
    if (element_count < 0)
      return 0;
    if ( 0 == mapped_string_capacity )
      return element_count+1; // +1 for null terminator
  }
  else if ( 0 == mapped_string_capacity )
    return element_count; // no +1 here

  if ( element_count > mapped_string_capacity )
    return 0;

  char c;
  const char* s1 = string + element_count;
  switch (map_type)
  {
  case ON_StringMapOrdinalType::UpperOrdinal:
  case ON_StringMapOrdinalType::MinimumOrdinal:
    while (string < s1)
    {
      c = *string++;
      if (c >= 'a' && c <= 'z')
        c -= 0x20;
      *mapped_string++ = c;
    }
    break;

  case ON_StringMapOrdinalType::LowerOrdinal:
    while (string < s1)
    {
      c = *string++;
      if (c >= 'A' && c <= 'Z')
        c += 0x20;
      *mapped_string++ = c;
    }
    break;

  default:
    while (string < s1)
      *mapped_string++ = *string++;
    break;
  }

  if ( element_count < mapped_string_capacity )
    *mapped_string = 0;

  return element_count;
}